

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  BaseType BVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  mapped_type *pmVar6;
  SPIRType *type_00;
  CompilerError *this_00;
  uint uVar7;
  BufferPackingStandard extraout_EDX;
  uint uVar8;
  ulong uVar9;
  CompilerGLSL *this_01;
  uint uVar10;
  Bitset member_flags;
  
  bVar2 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if (bVar2) {
    if (type->pointer == false) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Types in PhysicalStorageBufferEXT must be pointers.");
    }
    else {
      if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
        return 8;
      }
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                );
    }
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = this;
  bVar2 = Compiler::is_array(&this->super_Compiler,type);
  if (bVar2) {
    uVar3 = to_array_size_literal(this,type);
    uVar4 = type_to_packed_array_stride(this,type,flags,packing);
    uVar4 = uVar4 * uVar3;
    if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer) {
      return uVar4;
    }
    if (type->basetype == Struct) {
      return uVar4;
    }
    uVar8 = type->width;
    uVar7 = type->vecsize;
    goto LAB_00120de1;
  }
  if (type->basetype == Struct) {
    uVar3 = 0;
    uVar7 = 1;
    for (uVar8 = 0; uVar9 = (ulong)uVar8,
        uVar9 < (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size; uVar8 = uVar8 + 1) {
      pmVar6 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(this->super_Compiler).ir.meta,&(type->super_IVariant).self);
      Bitset::Bitset(&member_flags,
                     &(pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar9].
                      decoration_flags);
      type_00 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,
                           (type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar9]
                           .id);
      uVar4 = type_to_packed_alignment(this,type_00,&member_flags,packing);
      BVar1 = type_00->basetype;
      uVar5 = type_to_packed_size(this,type_00,&member_flags,packing);
      uVar10 = 1;
      if (BVar1 == Struct) {
        uVar10 = uVar4;
      }
      if (uVar7 < uVar4) {
        uVar7 = uVar4;
      }
      uVar3 = uVar5 + (-uVar7 & (uVar3 + uVar7) - 1);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&member_flags.higher._M_h);
      uVar7 = uVar10;
    }
    return uVar3;
  }
  uVar3 = type_to_packed_base_size(this_01,type,extraout_EDX);
  if ((packing & ~BufferPackingStd430) == BufferPackingScalar) {
    return uVar3 * type->vecsize * type->columns;
  }
  uVar7 = type->vecsize;
  uVar8 = type->columns;
  uVar5 = uVar7 * uVar3;
  uVar4 = 0;
  if (uVar8 == 1) {
    uVar4 = uVar5;
  }
  uVar9 = flags->lower;
  if ((1 < uVar8 & (byte)((uVar9 & 0xffffffff) >> 5) & 7) == 1) {
    if ((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) {
      uVar4 = uVar3 * uVar8 * 4;
      goto LAB_00120f8e;
    }
    if (uVar7 != 3) {
      uVar4 = uVar5 * uVar8;
      goto LAB_00120f8e;
    }
    if ((uVar9 & 0x10) != 0) goto LAB_00120f9d;
    uVar4 = uVar3 * uVar8 * 4;
  }
  else {
LAB_00120f8e:
    if (((byte)uVar9 >> 4 & 1 < uVar7) != 0) {
LAB_00120f9d:
      if (((packing < BufferPackingScalar) && ((0x35U >> (packing & 0x1f) & 1) != 0)) ||
         (uVar8 == 3)) {
        uVar4 = uVar5 * 4;
      }
      else {
        uVar4 = uVar5 * uVar8;
      }
    }
  }
  if ((packing & ~BufferPackingStd430) != BufferPackingHLSLCbuffer || uVar8 < 2) {
    return uVar4;
  }
  uVar8 = type->width;
LAB_00120de1:
  return (uVar8 >> 3) * (uVar7 - 4) + uVar4;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (is_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (is_array(type))
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}